

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

void sparse_list_clear(pax *pax)

{
  sparse_block_conflict *__ptr;
  
  __ptr = pax->sparse_list;
  while (__ptr != (sparse_block_conflict *)0x0) {
    pax->sparse_list = __ptr->next;
    free(__ptr);
    __ptr = pax->sparse_list;
  }
  pax->sparse_tail = (sparse_block_conflict *)0x0;
  return;
}

Assistant:

static void
sparse_list_clear(struct pax *pax)
{
	while (pax->sparse_list != NULL) {
		struct sparse_block *sb = pax->sparse_list;
		pax->sparse_list = sb->next;
		free(sb);
	}
	pax->sparse_tail = NULL;
}